

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_descriptor_set_layout
               (StateRecorder *recorder,VkDescriptorSetLayoutCreateInfo *layout,Hash *out_hash)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t j;
  ulong uVar5;
  ulong uVar6;
  Hash hash;
  Hasher local_50;
  ulong *local_48;
  VkDescriptorSetLayoutCreateInfo *local_40;
  ulong local_38;
  
  uVar5 = (ulong)layout->bindingCount;
  uVar3 = (uVar5 ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ (ulong)layout->flags;
  uVar6 = 0;
  local_48 = out_hash;
  local_40 = layout;
  do {
    if (uVar5 <= uVar6) {
      local_50.h = uVar3;
      bVar2 = hash_pnext_chain(recorder,&local_50,layout->pNext,(DynamicStateInfo *)0x0,0);
      if (bVar2) {
        *local_48 = local_50.h;
      }
      return bVar2;
    }
    pVVar1 = layout->pBindings;
    uVar4 = (ulong)pVVar1[uVar6].descriptorCount;
    uVar3 = ((ulong)pVVar1[uVar6].descriptorType ^
            ((uVar3 * 0x100000001b3 ^ (ulong)pVVar1[uVar6].binding) * 0x100000001b3 ^ uVar4) *
            0x100000001b3) * 0x100000001b3 ^ (ulong)pVVar1[uVar6].stageFlags;
    if (pVVar1[uVar6].descriptorType < VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE &&
        pVVar1[uVar6].pImmutableSamplers != (VkSampler *)0x0) {
      local_38 = uVar6;
      for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
        bVar2 = StateRecorder::get_hash_for_sampler
                          (recorder,pVVar1[uVar6].pImmutableSamplers[uVar5],&local_50.h);
        if (!bVar2) {
          return false;
        }
        uVar3 = (local_50.h & 0xffffffff ^ uVar3 * 0x100000001b3) * 0x100000001b3 ^
                local_50.h >> 0x20;
        uVar4 = (ulong)pVVar1[uVar6].descriptorCount;
      }
      uVar5 = (ulong)local_40->bindingCount;
      layout = local_40;
      uVar6 = local_38;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool compute_hash_descriptor_set_layout(const StateRecorder &recorder, const VkDescriptorSetLayoutCreateInfo &layout, Hash *out_hash)
{
	Hasher h;

	h.u32(layout.bindingCount);
	h.u32(layout.flags);
	for (uint32_t i = 0; i < layout.bindingCount; i++)
	{
		auto &binding = layout.pBindings[i];
		h.u32(binding.binding);
		h.u32(binding.descriptorCount);
		h.u32(binding.descriptorType);
		h.u32(binding.stageFlags);

		if (binding.pImmutableSamplers &&
			(binding.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER ||
		    binding.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER))
		{
			for (uint32_t j = 0; j < binding.descriptorCount; j++)
			{
				Hash hash;
				if (!recorder.get_hash_for_sampler(binding.pImmutableSamplers[j], &hash))
					return false;
				h.u64(hash);
			}
		}
	}

	if (!hash_pnext_chain(&recorder, h, layout.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}